

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

string * __thiscall
symbols::StringObject::toString_abi_cxx11_(string *__return_storage_ptr__,StringObject *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,"\'",&this->value);
  std::operator+(__return_storage_ptr__,&bStack_38,"\'");
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string StringObject::toString() const
{
    return "'" + value + "'";
}